

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePicker::mousePressEvent(DateTimePicker *this,QMouseEvent *event)

{
  int iVar1;
  DateTimePickerPrivate *this_00;
  QPoint QVar2;
  double dVar3;
  double in_XMM1_Qa;
  QPointF local_20;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    ((this->d).d)->scrolling = false;
    dVar3 = (double)QEventPoint::position();
    QVar2.xp = (int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3);
    QVar2.yp = (int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                    in_XMM1_Qa);
    ((this->d).d)->mousePos = QVar2;
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = true;
    dVar3 = (double)QEventPoint::position();
    local_20.xp = (qreal)(int)((double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) +
                              dVar3);
    local_20.yp = (qreal)(int)((double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000)
                              + in_XMM1_Qa);
    DateTimePickerPrivate::findMovableSection(this_00,&local_20);
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
DateTimePicker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->scrolling = false;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->findMovableSection( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}